

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_1::StringBaseTextGenerator::~StringBaseTextGenerator
          (StringBaseTextGenerator *this)

{
  ~StringBaseTextGenerator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }